

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

int check_fixed_log(char *card,FILE *out)

{
  char *local_28;
  char *cptr;
  FILE *out_local;
  char *card_local;
  
  for (local_28 = card + 10; *local_28 == ' '; local_28 = local_28 + 1) {
  }
  if ((*local_28 == 'T') || (*local_28 == 'F')) {
    if ((long)local_28 - (long)card == 0x1d) {
      card_local._4_4_ = 1;
    }
    else {
      sprintf(errmes,"%.8s mandatory keyword is not in logical fixed format:",card);
      wrterr(out,errmes,1);
      print_fmt(out,card,0xd);
      print_fmt(out,"          -------------------^",0xd);
      card_local._4_4_ = 0;
    }
  }
  else {
    sprintf(errmes,"%.8s mandatory keyword does not have T or F logical value.",card);
    wrterr(out,errmes,1);
    card_local._4_4_ = 0;
  }
  return card_local._4_4_;
}

Assistant:

int check_fixed_log(char* card, FILE *out) 
{
    char *cptr;

    /* fixed format logical must have T or F in column 30 */

    cptr = &card[10];

    while (*cptr == ' ')cptr++;  /* skip leading spaces */

    if (*cptr != 'T' && *cptr != 'F') {
        sprintf(errmes,
            "%.8s mandatory keyword does not have T or F logical value.",
        card);
        wrterr(out,errmes,1); 
        return 0;
    }

    /* should be pointing to column 31 of the card */

    if ((cptr - card)  != 29) {
        sprintf(errmes,
            "%.8s mandatory keyword is not in logical fixed format:",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
        print_fmt(out,"          -------------------^",13);

        return 0;
    } 
    return 1; 
}